

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

int vorbis_commentheader_out(vorbis_comment *vc,ogg_packet *op)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  undefined1 local_48 [8];
  oggpack_buffer opb;
  ogg_packet *op_local;
  vorbis_comment *vc_local;
  
  opb.storage = (long)op;
  oggpack_writeinit((oggpack_buffer *)local_48);
  iVar1 = _vorbis_pack_comment((oggpack_buffer *)local_48,vc);
  if (iVar1 == 0) {
    sVar2 = oggpack_bytes((oggpack_buffer *)local_48);
    pvVar3 = malloc(sVar2);
    *(void **)opb.storage = pvVar3;
    pvVar3 = *(void **)opb.storage;
    sVar2 = oggpack_bytes((oggpack_buffer *)local_48);
    memcpy(pvVar3,(void *)opb._8_8_,sVar2);
    lVar4 = oggpack_bytes((oggpack_buffer *)local_48);
    *(long *)(opb.storage + 8) = lVar4;
    *(undefined8 *)(opb.storage + 0x10) = 0;
    *(undefined8 *)(opb.storage + 0x18) = 0;
    *(undefined8 *)(opb.storage + 0x20) = 0;
    *(undefined8 *)(opb.storage + 0x28) = 1;
    oggpack_writeclear((oggpack_buffer *)local_48);
    vc_local._4_4_ = 0;
  }
  else {
    oggpack_writeclear((oggpack_buffer *)local_48);
    vc_local._4_4_ = -0x82;
  }
  return vc_local._4_4_;
}

Assistant:

int vorbis_commentheader_out(vorbis_comment *vc,
                                          ogg_packet *op){

  oggpack_buffer opb;

  oggpack_writeinit(&opb);
  if(_vorbis_pack_comment(&opb,vc)){
    oggpack_writeclear(&opb);
    return OV_EIMPL;
  }

  op->packet = _ogg_malloc(oggpack_bytes(&opb));
  memcpy(op->packet, opb.buffer, oggpack_bytes(&opb));

  op->bytes=oggpack_bytes(&opb);
  op->b_o_s=0;
  op->e_o_s=0;
  op->granulepos=0;
  op->packetno=1;

  oggpack_writeclear(&opb);
  return 0;
}